

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O3

bool __thiscall QWidgetWindow::event(QWidgetWindow *this,QEvent *event)

{
  char cVar1;
  undefined1 uVar2;
  ushort uVar3;
  Data *pDVar4;
  uint uVar5;
  bool bVar6;
  QWidget *this_00;
  QObject *pQVar7;
  long in_FS_OFFSET;
  QAccessibleStateChangeEvent ev;
  code *local_48;
  undefined1 *puStack_40;
  QObject *local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->m_widget).wp.d;
  if ((pDVar4 == (Data *)0x0) ||
     (this_00 = (QWidget *)(this->m_widget).wp.value,
     *(int *)(pDVar4 + 4) == 0 || this_00 == (QWidget *)0x0)) goto LAB_003215fb;
  uVar3 = *(ushort *)(event + 8);
  uVar5 = (uint)uVar3;
  if (0x4c < uVar3) {
    if (uVar3 < 0xc2) {
      if (uVar3 < 0x67) {
        if (uVar5 == 0x5b || uVar3 < 0x5b) {
          if (uVar5 == 0x4d) {
            QWidget::repaint(this_00);
          }
          else {
            if (uVar5 == 0x57) goto LAB_00321357;
            if (uVar5 != 0x52) goto switchD_003212e4_caseD_c6;
            handleContextMenuEvent(this,(QContextMenuEvent *)event);
          }
        }
        else {
          if (1 < uVar5 - 0x5c) goto switchD_003212e4_caseD_c6;
LAB_00321357:
          handleTabletEvent(this,(QTabletEvent *)event);
        }
        goto LAB_00321636;
      }
      if (uVar3 - 0xad < 4) {
        if (*(int *)(pDVar4 + 4) == 0) {
          this_00 = (QWidget *)0x0;
        }
        QCoreApplication::forwardEvent(&this_00->super_QObject,event,(QEvent *)0x0);
        goto LAB_00321636;
      }
      if (uVar5 != 0x67) {
        if (uVar5 != 0x69) goto switchD_003212e4_caseD_c6;
        QWindow::event((QEvent *)this);
        handleWindowStateChangedEvent(this,(QWindowStateChangeEvent *)event);
        goto LAB_00321636;
      }
      qt_button_down = (QWidget *)0x0;
      goto LAB_003215d2;
    }
    switch(uVar3) {
    case 0xc2:
    case 0xc3:
    case 0xc4:
    case 0xd1:
      handleTouchEvent(this,(QTouchEvent *)event);
      break;
    case 0xc5:
      handleGestureEvent(this,(QNativeGestureEvent *)event);
      break;
    case 0xc6:
    case 199:
    case 200:
    case 0xc9:
    case 0xca:
    case 0xcb:
    case 0xcc:
    case 0xcd:
    case 0xcf:
    case 0xd0:
      goto switchD_003212e4_caseD_c6;
    case 0xce:
      handleExposeEvent(this,(QExposeEvent *)event);
      break;
    case 0xd2:
      local_48 = (code *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      QEvent::QEvent((QEvent *)&local_48,ThemeChange);
      pDVar4 = (this->m_widget).wp.d;
      if ((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) {
        pQVar7 = (QObject *)0x0;
      }
      else {
        pQVar7 = (this->m_widget).wp.value;
      }
      QCoreApplication::forwardEvent(pQVar7,(QEvent *)&local_48,event);
      QEvent::~QEvent((QEvent *)&local_48);
      break;
    default:
      if (uVar5 == 0xde) {
        handleDevicePixelRatioChange(this);
      }
      else {
        if (uVar5 != 0xe3) goto switchD_003212e4_caseD_c6;
        QWidgetPrivate::updateContentsRect(*(QWidgetPrivate **)&this_00->field_0x8);
      }
      uVar3 = *(ushort *)(event + 8);
switchD_003212e4_caseD_c6:
      if ((((uVar3 - 0xc < 0x3c) && ((0x9000000000000e1U >> ((ulong)(uVar3 - 0xc) & 0x3f) & 1) != 0)
           ) || (uVar3 == 1)) || (uVar3 == 0xaa)) {
LAB_003215fb:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          uVar2 = QWindow::event((QEvent *)this);
          return (bool)uVar2;
        }
        goto LAB_00321654;
      }
LAB_003215d2:
      pDVar4 = (this->m_widget).wp.d;
      if ((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) {
        pQVar7 = (QObject *)0x0;
      }
      else {
        pQVar7 = (this->m_widget).wp.value;
      }
      cVar1 = QCoreApplication::forwardEvent(pQVar7,event,(QEvent *)0x0);
      bVar6 = true;
      if (cVar1 == '\0') goto LAB_003215fb;
      goto LAB_00321639;
    }
    goto LAB_00321636;
  }
  switch(uVar3) {
  case 2:
  case 3:
  case 4:
  case 5:
    handleMouseEvent(this,(QMouseEvent *)event);
    break;
  case 6:
  case 7:
switchD_003212b4_caseD_6:
    handleKeyEvent(this,(QKeyEvent *)event);
    break;
  case 8:
    handleFocusInEvent(this,(QFocusEvent *)event);
    pDVar4 = (this->m_widget).wp.d;
    if (pDVar4 != (Data *)0x0) goto LAB_0032150e;
LAB_0032151b:
    local_38 = (QObject *)0x0;
    goto LAB_0032151d;
  case 9:
LAB_0032150e:
    if (*(int *)(pDVar4 + 4) == 0) goto LAB_0032151b;
    local_38 = (this->m_widget).wp.value;
LAB_0032151d:
    uStack_30 = 0xaaaaaaaaffffffff;
    local_48 = QCss::ValueExtractor::extractGeometry;
    local_28 = 0x40000000;
    puStack_40 = (undefined1 *)0xaaaaaaaa0000800a;
    QAccessible::updateAccessibility((QAccessibleEvent *)&local_48);
    QAccessibleStateChangeEvent::~QAccessibleStateChangeEvent
              ((QAccessibleStateChangeEvent *)&local_48);
    bVar6 = false;
    goto LAB_00321639;
  case 10:
  case 0xb:
    handleEnterLeaveEvent(this,event);
    break;
  case 0xc:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
    goto switchD_003212e4_caseD_c6;
  case 0xd:
    handleMoveEvent(this,(QMoveEvent *)event);
    break;
  case 0xe:
    handleResizeEvent(this,(QResizeEvent *)event);
    break;
  case 0x17:
    bVar6 = true;
    if (QApplicationPrivate::focus_widget != (QWidget *)0x0) {
      if ((QApplicationPrivate::focus_widget->data->widget_attributes & 0x4000) != 0) {
        QGuiApplication::inputMethod();
        QInputMethod::commit();
      }
      QCoreApplication::forwardEvent
                (&QApplicationPrivate::focus_widget->super_QObject,event,(QEvent *)0x0);
    }
    goto LAB_00321639;
  case 0x1f:
    handleWheelEvent(this,(QWheelEvent *)event);
    break;
  default:
    switch(uVar3) {
    case 0x3c:
      handleDragEnterEvent(this,(QDragMoveEvent *)event,(QWidget *)0x0);
      break;
    case 0x3d:
      handleDragMoveEvent(this,(QDragMoveEvent *)event);
      break;
    case 0x3e:
      handleDragLeaveEvent(this,(QDragLeaveEvent *)event);
      break;
    case 0x3f:
      handleDropEvent(this,(QDropEvent *)event);
      break;
    default:
      if (uVar3 != 0x33) goto switchD_003212e4_caseD_c6;
      goto switchD_003212b4_caseD_6;
    }
  }
LAB_00321636:
  bVar6 = true;
LAB_00321639:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar6;
  }
LAB_00321654:
  __stack_chk_fail();
}

Assistant:

bool QWidgetWindow::event(QEvent *event)
{
    if (!m_widget)
        return QWindow::event(event);

    switch (event->type()) {
    case QEvent::Enter:
    case QEvent::Leave:
        handleEnterLeaveEvent(event);
        return true;

    // these should not be sent to QWidget, the corresponding events
    // are sent by QApplicationPrivate::notifyActiveWindowChange()
    case QEvent::FocusIn:
        handleFocusInEvent(static_cast<QFocusEvent *>(event));
        Q_FALLTHROUGH();
    case QEvent::FocusOut: {
#if QT_CONFIG(accessibility)
        QAccessible::State state;
        state.active = true;
        QAccessibleStateChangeEvent ev(m_widget, state);
        QAccessible::updateAccessibility(&ev);
#endif
        return false; }

    case QEvent::FocusAboutToChange:
        if (QApplicationPrivate::focus_widget) {
            if (QApplicationPrivate::focus_widget->testAttribute(Qt::WA_InputMethodEnabled))
                QGuiApplication::inputMethod()->commit();

            QGuiApplication::forwardEvent(QApplicationPrivate::focus_widget, event);
        }
        return true;

    case QEvent::KeyPress:
    case QEvent::KeyRelease:
    case QEvent::ShortcutOverride:
        handleKeyEvent(static_cast<QKeyEvent *>(event));
        return true;

    case QEvent::MouseMove:
    case QEvent::MouseButtonPress:
    case QEvent::MouseButtonRelease:
    case QEvent::MouseButtonDblClick:
        handleMouseEvent(static_cast<QMouseEvent *>(event));
        return true;

    case QEvent::NonClientAreaMouseMove:
    case QEvent::NonClientAreaMouseButtonPress:
    case QEvent::NonClientAreaMouseButtonRelease:
    case QEvent::NonClientAreaMouseButtonDblClick:
        handleNonClientAreaMouseEvent(static_cast<QMouseEvent *>(event));
        return true;

    case QEvent::TouchBegin:
    case QEvent::TouchUpdate:
    case QEvent::TouchEnd:
    case QEvent::TouchCancel:
        handleTouchEvent(static_cast<QTouchEvent *>(event));
        return true;

    case QEvent::Move:
        handleMoveEvent(static_cast<QMoveEvent *>(event));
        return true;

    case QEvent::Resize:
        handleResizeEvent(static_cast<QResizeEvent *>(event));
        return true;

#if QT_CONFIG(wheelevent)
    case QEvent::Wheel:
        handleWheelEvent(static_cast<QWheelEvent *>(event));
        return true;
#endif

#if QT_CONFIG(draganddrop)
    case QEvent::DragEnter:
        handleDragEnterEvent(static_cast<QDragEnterEvent *>(event));
        return true;
    case QEvent::DragMove:
        handleDragMoveEvent(static_cast<QDragMoveEvent *>(event));
        return true;
    case QEvent::DragLeave:
        handleDragLeaveEvent(static_cast<QDragLeaveEvent *>(event));
        return true;
    case QEvent::Drop:
        handleDropEvent(static_cast<QDropEvent *>(event));
        return true;
#endif

    case QEvent::Expose:
        handleExposeEvent(static_cast<QExposeEvent *>(event));
        return true;

    case QEvent::WindowStateChange:
        QWindow::event(event); // Update QWindow::Visibility and emit signals.
        handleWindowStateChangedEvent(static_cast<QWindowStateChangeEvent *>(event));
        return true;

    case QEvent::ThemeChange: {
        QEvent widgetEvent(QEvent::ThemeChange);
        QCoreApplication::forwardEvent(m_widget, &widgetEvent, event);
    }
        return true;

#if QT_CONFIG(tabletevent)
    case QEvent::TabletPress:
    case QEvent::TabletMove:
    case QEvent::TabletRelease:
        handleTabletEvent(static_cast<QTabletEvent *>(event));
        return true;
#endif

#ifndef QT_NO_GESTURES
    case QEvent::NativeGesture:
        handleGestureEvent(static_cast<QNativeGestureEvent *>(event));
        return true;
#endif

#ifndef QT_NO_CONTEXTMENU
    case QEvent::ContextMenu:
        handleContextMenuEvent(static_cast<QContextMenuEvent *>(event));
        return true;
#endif // QT_NO_CONTEXTMENU

    case QEvent::WindowBlocked:
        qt_button_down = nullptr;
        break;

    case QEvent::UpdateRequest:
        // This is not the same as an UpdateRequest for a QWidget. That just
        // syncs the backing store while here we also must mark as dirty.
        m_widget->repaint();
        return true;

    case QEvent::DevicePixelRatioChange:
        handleDevicePixelRatioChange();
        break;

    case QEvent::SafeAreaMarginsChange:
        QWidgetPrivate::get(m_widget)->updateContentsRect();
        break;

    default:
        break;
    }

    if (shouldBePropagatedToWidget(event) && QCoreApplication::forwardEvent(m_widget, event))
        return true;

    return QWindow::event(event);
}